

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.h
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::Event
          (Event *this,Type type,StringPiece name)

{
  char *pcVar1;
  
  pcVar1 = name.ptr_;
  this->type_ = type;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  if (pcVar1 == (char *)0x0) {
    (this->name_)._M_string_length = 0;
    (this->name_).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->name_,pcVar1,pcVar1 + name.length_);
  }
  (this->value_)._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003c8cd8;
  (this->value_).type_ = TYPE_NULL;
  (this->value_).field_2.i32_ = 0;
  (this->value_).use_strict_base64_decoding_ = false;
  (this->value_storage_)._M_dataplus._M_p = (pointer)&(this->value_storage_).field_2;
  (this->value_storage_)._M_string_length = 0;
  (this->value_storage_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Event(Type type, StringPiece name)
          : type_(type), name_(name), value_(DataPiece::NullData()) {}